

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall cmFileAPI::BuildReply(Value *__return_storage_ptr__,cmFileAPI *this,Query *q)

{
  cmFileAPI *pcVar1;
  pointer pbVar2;
  Value *pVVar3;
  Value *this_00;
  Object *extraout_RDX;
  Object *extraout_RDX_00;
  Object *extraout_RDX_01;
  Object *o;
  cmFileAPI *this_01;
  pointer key;
  ValueHolder local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_50;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  this_01 = (cmFileAPI *)
            (q->Known).super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (cmFileAPI *)
           (q->Known).super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pcVar1) {
    o = extraout_RDX;
    do {
      ObjectName_abi_cxx11_((string *)local_78,this_01,o);
      pVVar3 = AddReplyIndexObject(this,(Object *)this_01);
      this_00 = Json::Value::operator[](__return_storage_ptr__,(String *)local_78);
      Json::Value::operator=(this_00,pVVar3);
      o = extraout_RDX_00;
      if (local_78[0] != &local_68) {
        operator_delete(local_78[0].string_,local_68._M_allocated_capacity + 1);
        o = extraout_RDX_01;
      }
      this_01 = (cmFileAPI *)&(this_01->APIv1)._M_string_length;
    } while (this_01 != pcVar1);
  }
  key = (q->Unknown).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (q->Unknown).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (key != pbVar2) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unknown query file","");
      BuildReplyError((Value *)local_78,&local_50);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,key);
      Json::Value::operator=(pVVar3,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      key = key + 1;
    } while (key != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReply(Query const& q)
{
  Json::Value reply = Json::objectValue;
  for (Object const& o : q.Known) {
    std::string const& name = ObjectName(o);
    reply[name] = this->AddReplyIndexObject(o);
  }

  for (std::string const& name : q.Unknown) {
    reply[name] = cmFileAPI::BuildReplyError("unknown query file");
  }
  return reply;
}